

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

void __thiscall
particleSamples::perform_resonance_feed_down
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *input_particle_list)

{
  pointer ppvVar1;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar2;
  particle_decay *this_00;
  int iVar3;
  pointer ppvVar4;
  long lVar5;
  long lVar6;
  _List_node_base *p_Var7;
  value_type *pvVar8;
  particle_info *ppVar9;
  undefined8 *puVar10;
  anon_struct_120_15_f999644b *part_i;
  pointer paVar11;
  pointer paVar12;
  byte bVar13;
  particle_info in_stack_fffffffffffffe78;
  list<particle_info,_std::allocator<particle_info>_> current_ev_list;
  vector<particle_info,_std::allocator<particle_info>_> daughter_list;
  string local_c8;
  value_type part_i_1;
  
  bVar13 = 0;
  std::__cxx11::string::string
            ((string *)&local_c8,"perform resonance decays... ",(allocator *)&part_i_1);
  pretty_ostream::info(&this->messager,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  ppvVar1 = (input_particle_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  for (ppvVar4 = (input_particle_list->
                 super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppvVar4 != ppvVar1;
      ppvVar4 = ppvVar4 + 1) {
    current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&current_ev_list;
    current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>._M_impl._M_node.
    _M_size = 0;
    paVar12 = ((*ppvVar4)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    for (paVar11 = ((*ppvVar4)->super__Vector_base<particle_info,_std::allocator<particle_info>_>).
                   _M_impl.super__Vector_impl_data._M_start; paVar11 != paVar12;
        paVar11 = paVar11 + 1) {
      std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::push_back
                (&current_ev_list,paVar11);
    }
    pvVar2 = (input_particle_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar6];
    paVar11 = (pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&(pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl
                 .super__Vector_impl_data + 8) != paVar11) {
      *(pointer *)
       ((long)&(pvVar2->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
               super__Vector_impl_data + 8) = paVar11;
    }
    while (current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>._M_impl.
           _M_node._M_size != 0) {
      p_Var7 = current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>.
               _M_impl._M_node.super__List_node_base._M_next + 1;
      ppVar9 = &part_i_1;
      for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
        *(_List_node_base **)ppVar9 = p_Var7->_M_next;
        p_Var7 = (_List_node_base *)&p_Var7[-(ulong)bVar13]._M_prev;
        ppVar9 = (particle_info *)((long)ppVar9 + (ulong)bVar13 * -0x10 + 8);
      }
      std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::pop_front(&current_ev_list)
      ;
      daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      particle_decay::perform_decays(this->decayer_ptr,&part_i_1,&daughter_list);
      paVar11 = daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (paVar12 = daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>
                     ._M_impl.super__Vector_impl_data._M_start; paVar12 != paVar11;
          paVar12 = paVar12 + 1) {
        this_00 = this->decayer_ptr;
        pvVar8 = paVar12;
        puVar10 = (undefined8 *)&stack0xfffffffffffffe78;
        for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar10 = *(undefined8 *)pvVar8;
          pvVar8 = (value_type *)((long)pvVar8 + (ulong)bVar13 * -0x10 + 8);
          puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
        }
        iVar3 = particle_decay::check_particle_stable(this_00,in_stack_fffffffffffffe78);
        if (iVar3 == 1) {
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((input_particle_list->
                     super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar6],paVar12);
        }
        else {
          std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::push_back
                    (&current_ev_list,paVar12);
        }
      }
      if (daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
          super__Vector_impl_data._M_start) {
        daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl.
        super__Vector_impl_data._M_finish =
             daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>._M_impl
             .super__Vector_impl_data._M_start;
      }
      std::_Vector_base<particle_info,_std::allocator<particle_info>_>::~_Vector_base
                (&daughter_list.super__Vector_base<particle_info,_std::allocator<particle_info>_>);
    }
    std::__cxx11::list<particle_info,_std::allocator<particle_info>_>::clear
              ((list<particle_info,_std::allocator<particle_info>_> *)
               &current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>);
    lVar6 = lVar6 + 1;
    std::__cxx11::_List_base<particle_info,_std::allocator<particle_info>_>::_M_clear
              (&current_ev_list.super__List_base<particle_info,_std::allocator<particle_info>_>);
  }
  return;
}

Assistant:

void particleSamples::perform_resonance_feed_down(
    vector<vector<particle_info> *> *input_particle_list) {
    messager.info("perform resonance decays... ");
    // loop over events
    int ievent = 0;
    for (auto &ev_i : (*input_particle_list)) {
        // create a temporary particle list
        std::list<particle_info> current_ev_list;

        // copy all particles into the temp list
        for (auto &part_i : (*ev_i)) {
            current_ev_list.push_back(part_i);
        }

        (*input_particle_list)[ievent]->clear();

        // perform resonance decays
        while (current_ev_list.size() > 0) {
            auto part_i = current_ev_list.front();
            current_ev_list.pop_front();
            vector<particle_info> daughter_list;
            decayer_ptr->perform_decays(part_i, daughter_list);
            for (auto &daughter_i : daughter_list) {
                if (decayer_ptr->check_particle_stable(daughter_i) == 1) {
                    (*input_particle_list)[ievent]->push_back(daughter_i);
                } else {
                    current_ev_list.push_back(daughter_i);
                }
            }
            daughter_list.clear();
        }
        current_ev_list.clear();
        ievent++;
    }
}